

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

TimingControl * __thiscall slang::ast::CovergroupType::getCoverageEvent(CovergroupType *this)

{
  bool bVar1;
  CovergroupDeclarationSyntax *pCVar2;
  TimingControl **ppTVar3;
  EventControlWithExpressionSyntax *pEVar4;
  socklen_t __len;
  Symbol *in_RDI;
  LookupLocation LVar5;
  ASTContext context;
  LookupLocation ll;
  SyntaxNode *evSyntax;
  SyntaxNode *syntax;
  Scope *scope;
  void **in_stack_ffffffffffffff28;
  Symbol *in_stack_ffffffffffffff30;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff40;
  Scope *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  bitmask<slang::ast::ASTFlags> local_a8;
  Scope *local_a0;
  undefined8 local_98;
  sockaddr local_90 [3];
  Scope *local_58;
  uint32_t local_50;
  Scope *local_48;
  uint32_t local_40;
  Scope *local_38;
  undefined8 local_30;
  SyntaxNode *local_28;
  SyntaxNode *local_20;
  Scope *local_18;
  
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<const_slang::ast::TimingControl_*> *)0x4389e8);
  if (bVar1) {
    ppTVar3 = std::optional<const_slang::ast::TimingControl_*>::operator*
                        ((optional<const_slang::ast::TimingControl_*> *)0x4389ff);
    return *ppTVar3;
  }
  local_18 = Symbol::getParentScope(in_RDI);
  local_20 = Symbol::getSyntax(in_RDI);
  if ((local_18 != (Scope *)0x0) && (local_20 != (SyntaxNode *)0x0)) {
    pCVar2 = slang::syntax::SyntaxNode::as<slang::syntax::CovergroupDeclarationSyntax>(local_20);
    local_28 = pCVar2->event;
    if (local_28 != (SyntaxNode *)0x0) {
      local_38 = LookupLocation::min;
      local_30 = DAT_00dfe670;
      bVar1 = std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
              empty((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                    0x438aab);
      if (!bVar1) {
        std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::back
                  ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                   in_stack_ffffffffffffff30);
        LVar5 = LookupLocation::after(in_stack_ffffffffffffff30);
        local_58 = LVar5.scope;
        local_50 = LVar5.index;
        local_30 = CONCAT44(local_30._4_4_,local_50);
        local_48 = local_58;
        local_40 = local_50;
        local_38 = local_58;
      }
      in_stack_ffffffffffffff30 = (Symbol *)&in_RDI[1].name;
      local_a0 = local_38;
      local_98 = local_30;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_a8,None);
      LVar5._8_8_ = in_stack_ffffffffffffff50;
      LVar5.scope = in_stack_ffffffffffffff48;
      ASTContext::ASTContext
                ((ASTContext *)in_RDI,(Scope *)in_stack_ffffffffffffff30,LVar5,
                 in_stack_ffffffffffffff40);
      if (local_28->kind == BlockCoverageEvent) {
        slang::syntax::SyntaxNode::as<slang::syntax::BlockCoverageEventSyntax>(local_28);
        not_null<slang::syntax::BlockEventExpressionSyntax_*>::operator*
                  ((not_null<slang::syntax::BlockEventExpressionSyntax_*> *)0x438b8c);
        BlockEventListControl::fromSyntax
                  ((BlockEventExpressionSyntax *)context.flags.m_bits,(ASTContext *)context._8_8_);
        std::optional<slang::ast::TimingControl_const*>::operator=
                  ((optional<const_slang::ast::TimingControl_*> *)in_stack_ffffffffffffff40.m_bits,
                   (TimingControl **)in_RDI);
        ppTVar3 = std::optional<const_slang::ast::TimingControl_*>::operator*
                            ((optional<const_slang::ast::TimingControl_*> *)0x438bc5);
        return *ppTVar3;
      }
      if (local_28->kind == EventControlWithExpression) {
        pEVar4 = slang::syntax::SyntaxNode::as<slang::syntax::EventControlWithExpressionSyntax>
                           (local_28);
        TimingControl::bind((int)pEVar4,local_90,__len);
        std::optional<slang::ast::TimingControl_const*>::operator=
                  ((optional<const_slang::ast::TimingControl_*> *)in_stack_ffffffffffffff40.m_bits,
                   (TimingControl **)in_RDI);
        ppTVar3 = std::optional<const_slang::ast::TimingControl_*>::operator*
                            ((optional<const_slang::ast::TimingControl_*> *)0x438c2b);
        return *ppTVar3;
      }
    }
  }
  std::optional<slang::ast::TimingControl_const*>::operator=
            ((optional<const_slang::ast::TimingControl_*> *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  return (TimingControl *)0x0;
}

Assistant:

const TimingControl* CovergroupType::getCoverageEvent() const {
    if (event)
        return *event;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    if (scope && syntax) {
        if (auto evSyntax = syntax->as<CovergroupDeclarationSyntax>().event) {
            LookupLocation ll = LookupLocation::min;
            if (!arguments.empty())
                ll = LookupLocation::after(*arguments.back());

            ASTContext context(*this, ll);

            if (evSyntax->kind == SyntaxKind::BlockCoverageEvent) {
                event = &BlockEventListControl::fromSyntax(
                    *evSyntax->as<BlockCoverageEventSyntax>().expr, context);
                return *event;
            }
            else if (evSyntax->kind == SyntaxKind::EventControlWithExpression) {
                event = &TimingControl::bind(evSyntax->as<EventControlWithExpressionSyntax>(),
                                             context);
                return *event;
            }
        }
    }

    event = nullptr;
    return nullptr;
}